

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_CheckAddressNetType_elements_Test::~AddressFactory_CheckAddressNetType_elements_Test
          (AddressFactory_CheckAddressNetType_elements_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_elements)
{
  AddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}